

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_transfers.c
# Opt level: O3

void CGTFS_RecordTransfer(void)

{
  int iVar1;
  transfer_t t_1;
  char *field_values [4];
  char *field_names [4];
  transfer_t local_1c0;
  undefined1 local_138 [16];
  char *local_128;
  char *pcStack_120;
  undefined1 local_a8 [16];
  char *local_98;
  char *pcStack_90;
  
  iVar1 = greatest_test_pre("transfer_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      local_98 = "transfer_type";
      pcStack_90 = "min_transfer_time";
      local_a8._0_8_ = "from_stop_id";
      local_a8._8_8_ = "to_stop_id";
      local_128 = "2";
      pcStack_120 = "120";
      local_138._0_8_ = "S180";
      local_138._8_8_ = "R360";
      read_transfer(&local_1c0,4,(char **)local_a8,(char **)local_138);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("S180",&local_1c0,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x14;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_001238dc:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"S180\" != t_1.from_stop_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("R360",local_1c0.to_stop_id,&greatest_type_info_string,(void *)0x0);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x15;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_001238dc;
          greatest_info.msg = "\"R360\" != t_1.to_stop_id";
        }
        else if (local_1c0.transfer_type == TT_TIME_REQUIRED) {
          greatest_info.assertions = greatest_info.assertions + 2;
          if (local_1c0.min_transfer_time == 0x78) {
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_00123940;
          }
          greatest_info.fail_line = 0x17;
          greatest_info.msg = "120 != t_1.min_transfer_time";
        }
        else {
          greatest_info.fail_line = 0x16;
          greatest_info.msg = "TT_TIME_REQUIRED != t_1.transfer_type";
          greatest_info.assertions = greatest_info.assertions + 1;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_transfers.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00123aa8;
    }
LAB_00123940:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("transfer_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&local_1c0,"0STP8",0x88);
    memcpy((transfer_t *)local_a8,"0STP8",0x88);
    memcpy(local_138,"0STP8",0x88);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_transfer(&local_1c0,(transfer_t *)local_a8);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_transfer(&local_1c0,(transfer_t *)local_138);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_transfer((transfer_t *)local_a8,(transfer_t *)local_138);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_00123a45;
        }
        greatest_info.fail_line = 0x34;
        greatest_info.msg = "0 != equal_transfer(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x33;
        greatest_info.msg = "0 != equal_transfer(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x32;
      greatest_info.msg = "1 != equal_transfer(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_transfers.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_00123aa8:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_transfers.c"
      ;
      abort();
    }
  }
LAB_00123a45:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordTransfer) {
    RUN_TEST(transfer_read);
    RUN_TEST(transfer_compare);
}